

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O1

double __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_mutex>::log
          (ansicolor_sink<spdlog::details::console_mutex> *this,double __x)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  size_t __n;
  long in_RSI;
  undefined1 *__ptr;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined1 local_120 [256];
  
  __mutex = (pthread_mutex_t *)this->mutex_;
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  *(undefined8 *)(in_RSI + 0x28) = 0;
  *(undefined8 *)(in_RSI + 0x30) = 0;
  __ptr = local_120;
  (*((this->formatter_)._M_t.
     super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
     super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
     super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl)->_vptr_formatter[2])();
  if ((this->should_do_colors_ == true) && (*(ulong *)(in_RSI + 0x28) < *(ulong *)(in_RSI + 0x30)))
  {
    fwrite(__ptr,1,*(ulong *)(in_RSI + 0x28),(FILE *)this->target_file_);
    fwrite((this->colors_)._M_elems[*(uint *)(in_RSI + 0x10)]._M_dataplus._M_p,1,
           (this->colors_)._M_elems[*(uint *)(in_RSI + 0x10)]._M_string_length,
           (FILE *)this->target_file_);
    fwrite(__ptr + *(long *)(in_RSI + 0x28),1,*(long *)(in_RSI + 0x30) - *(long *)(in_RSI + 0x28),
           (FILE *)this->target_file_);
    fwrite((this->reset).data_,1,(this->reset).size_,(FILE *)this->target_file_);
    __ptr = __ptr + *(long *)(in_RSI + 0x30);
    __n = -*(long *)(in_RSI + 0x30);
  }
  else {
    __n = 0;
  }
  fwrite(__ptr,1,__n,(FILE *)this->target_file_);
  fflush((FILE *)this->target_file_);
  pthread_mutex_unlock(__mutex);
  return (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::log(const details::log_msg &msg)
{
    // Wrap the originally formatted message in color codes.
    // If color is not supported in the terminal, log as is instead.
    std::lock_guard<mutex_t> lock(mutex_);
    msg.color_range_start = 0;
    msg.color_range_end = 0;
    memory_buf_t formatted;
    formatter_->format(msg, formatted);
    if (should_do_colors_ && msg.color_range_end > msg.color_range_start)
    {
        // before color range
        print_range_(formatted, 0, msg.color_range_start);
        // in color range
        print_ccode_(colors_[msg.level]);
        print_range_(formatted, msg.color_range_start, msg.color_range_end);
        print_ccode_(reset);
        // after color range
        print_range_(formatted, msg.color_range_end, formatted.size());
    }
    else // no color
    {
        print_range_(formatted, 0, formatted.size());
    }
    fflush(target_file_);
}